

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpumon.cpp
# Opt level: O0

void __thiscall cpumon::cpumon(cpumon *this)

{
  initializer_list<prmon::parameter> __l;
  bool bVar1;
  Imonitor *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>,_bool>
  pVar2;
  parameter *param;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_list *__range1;
  parameter *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  parameter *in_stack_fffffffffffffc08;
  monitored_value *in_stack_fffffffffffffc10;
  parameter *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  string *in_stack_fffffffffffffc28;
  string *in_stack_fffffffffffffc30;
  iterator in_stack_fffffffffffffc38;
  parameter *in_stack_fffffffffffffc40;
  undefined8 **local_3a0;
  level_enum *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  MessageBase *in_stack_fffffffffffffd40;
  string local_248 [32];
  reference local_228;
  parameter *local_220;
  __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
  local_218;
  Imonitor *local_210;
  allocator local_201;
  string local_200 [38];
  undefined1 local_1da;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [55];
  allocator local_101;
  string local_100 [32];
  undefined1 **local_e0;
  undefined8 *local_d8 [12];
  undefined1 local_78 [96];
  undefined1 **local_18;
  undefined8 local_10;
  
  Imonitor::Imonitor(in_RDI);
  MessageBase::MessageBase((MessageBase *)0x326e85);
  in_RDI->_vptr_Imonitor = (_func_int **)&PTR__cpumon_003c3370;
  local_1da = 1;
  local_e0 = (undefined1 **)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"utime",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"s",&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"",&local_161);
  prmon::parameter::parameter
            (in_stack_fffffffffffffc40,&in_stack_fffffffffffffc38->m_name,in_stack_fffffffffffffc30,
             in_stack_fffffffffffffc28);
  local_e0 = (undefined1 **)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"stime",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"s",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"",&local_1d9);
  prmon::parameter::parameter
            (in_stack_fffffffffffffc40,&in_stack_fffffffffffffc38->m_name,in_stack_fffffffffffffc30,
             in_stack_fffffffffffffc28);
  local_1da = 0;
  local_18 = (undefined1 **)local_d8;
  local_10 = 2;
  std::allocator<prmon::parameter>::allocator((allocator<prmon::parameter> *)0x327083);
  __l._M_len = (size_type)in_stack_fffffffffffffc40;
  __l._M_array = in_stack_fffffffffffffc38;
  std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::vector
            ((vector<prmon::parameter,_std::allocator<prmon::parameter>_> *)
             in_stack_fffffffffffffc30,__l,(allocator_type *)in_stack_fffffffffffffc28);
  std::allocator<prmon::parameter>::~allocator((allocator<prmon::parameter> *)0x3270b4);
  local_3a0 = &local_18;
  do {
    local_3a0 = local_3a0 + -0xc;
    prmon::parameter::~parameter
              ((parameter *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
  } while (local_3a0 != local_d8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  in_RDI[0xb]._vptr_Imonitor = (_func_int **)0x0;
  in_RDI[0xc]._vptr_Imonitor = (_func_int **)0x0;
  in_RDI[9]._vptr_Imonitor = (_func_int **)0x0;
  in_RDI[10]._vptr_Imonitor = (_func_int **)0x0;
  in_RDI[7]._vptr_Imonitor = (_func_int **)0x0;
  in_RDI[8]._vptr_Imonitor = (_func_int **)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
         *)0x3271b7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"cpumon",&local_201);
  MessageBase::log_init
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  local_210 = in_RDI + 4;
  local_218._M_current =
       (parameter *)
       std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::begin
                 (in_stack_fffffffffffffbf8);
  local_220 = (parameter *)
              std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::end
                        ((vector<prmon::parameter,_std::allocator<prmon::parameter>_> *)
                         in_stack_fffffffffffffbf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                        *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                       (__normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                        *)in_stack_fffffffffffffbf8);
    if (!bVar1) break;
    local_228 = __gnu_cxx::
                __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                ::operator*(&local_218);
    prmon::parameter::get_name_abi_cxx11_(in_stack_fffffffffffffbf8);
    prmon::parameter::parameter
              ((parameter *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               in_stack_fffffffffffffc18);
    prmon::monitored_value::monitored_value
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(bool)in_stack_fffffffffffffc07,
               (mon_value)in_stack_fffffffffffffbf8);
    pVar2 = std::
            map<std::__cxx11::string,prmon::monitored_value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
            ::emplace<std::__cxx11::string_const,prmon::monitored_value>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
                        *)in_stack_fffffffffffffc10,&in_stack_fffffffffffffc08->m_name,
                       (monitored_value *)
                       CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
    in_stack_fffffffffffffc27 = pVar2.second;
    prmon::monitored_value::~monitored_value((monitored_value *)0x327347);
    prmon::parameter::~parameter
              ((parameter *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
    std::__cxx11::string::~string(local_248);
    __gnu_cxx::
    __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
    ::operator++(&local_218);
  }
  return;
}

Assistant:

cpumon::cpumon() : cpu_stats{} {
  log_init(MONITOR_NAME);
#undef MONITOR_NAME
  for (const auto& param : params) {
    cpu_stats.emplace(param.get_name(), prmon::monitored_value(param, true));
  }
}